

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

NodeKind __thiscall llvm::yaml::Input::getNodeKind(Input *this)

{
  bool bVar1;
  Input *this_local;
  
  bVar1 = isa<llvm::yaml::Input::ScalarHNode,llvm::yaml::Input::HNode*>(&this->CurrentNode);
  if (bVar1) {
    this_local._7_1_ = Scalar;
  }
  else {
    bVar1 = isa<llvm::yaml::Input::MapHNode,llvm::yaml::Input::HNode*>(&this->CurrentNode);
    if (bVar1) {
      this_local._7_1_ = Map;
    }
    else {
      bVar1 = isa<llvm::yaml::Input::SequenceHNode,llvm::yaml::Input::HNode*>(&this->CurrentNode);
      if (!bVar1) {
        llvm_unreachable_internal
                  ("Unsupported node kind",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLTraits.cpp"
                   ,0x16b);
      }
      this_local._7_1_ = Sequence;
    }
  }
  return this_local._7_1_;
}

Assistant:

NodeKind Input::getNodeKind() {
  if (isa<ScalarHNode>(CurrentNode))
    return NodeKind::Scalar;
  else if (isa<MapHNode>(CurrentNode))
    return NodeKind::Map;
  else if (isa<SequenceHNode>(CurrentNode))
    return NodeKind::Sequence;
  llvm_unreachable("Unsupported node kind");
}